

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::parser::expect(parser *this,token_type t)

{
  token_type t_00;
  long *plVar1;
  invalid_argument *this_00;
  size_type *psVar2;
  string error_msg;
  string local_c8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  string local_88;
  string_t local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->last_token == t) {
    return;
  }
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"parse error - unexpected ","")
  ;
  t_00 = this->last_token;
  if (t_00 == parse_error) {
    lexer::get_token_string(&local_68,&this->m_lexer);
    std::operator+(&local_48,"\'",&local_68);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_c8._M_dataplus._M_p = (pointer)*plVar1;
    psVar2 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_c8._M_dataplus._M_p == psVar2) {
      local_c8.field_2._M_allocated_capacity = *psVar2;
      local_c8.field_2._8_8_ = plVar1[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar2;
    }
    local_c8._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
  }
  else {
    lexer::token_type_name(&local_c8,t_00);
  }
  std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_c8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (t_00 == parse_error) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  lexer::token_type_name(&local_88,t);
  std::operator+(&local_c8,"; expected ",&local_88);
  std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_c8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,(string *)local_a8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void expect(typename lexer::token_type t) const
			{
				if (t != last_token)
				{
					std::string error_msg = "parse error - unexpected ";
					error_msg += (last_token == lexer::token_type::parse_error ? ("'" + m_lexer.get_token_string() +
						"'") :
						lexer::token_type_name(last_token));
					error_msg += "; expected " + lexer::token_type_name(t);
					JSON_THROW(std::invalid_argument(error_msg));
				}
			}